

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O1

Range * getVoronoiSrcRange(Range r)

{
  long lVar1;
  Range *in_RDI;
  int iVar2;
  int iVar3;
  int in_stack_00000008;
  int in_stack_0000000c;
  
  if (in_stack_00000008 == 1) {
    in_RDI->scale = 4;
    iVar2 = in_stack_0000000c + -2 >> 2;
    iVar3 = r.scale + -2 >> 2;
    in_RDI->x = iVar2;
    in_RDI->z = iVar3;
    in_RDI->sx = ((r.x + in_stack_0000000c + -2 >> 2) - iVar2) + 2;
    in_RDI->sz = ((r.z + r.scale + -2 >> 2) - iVar3) + 2;
    if (r.sz < 1) {
      in_RDI->sy = 0;
      iVar2 = 0;
      lVar1 = 0x14;
    }
    else {
      iVar2 = r.sx + -2 >> 2;
      in_RDI->y = iVar2;
      iVar2 = ((r.sx + r.sz + -2 >> 2) - iVar2) + 2;
      lVar1 = 0x18;
    }
    *(int *)((long)&in_RDI->scale + lVar1) = iVar2;
    return in_RDI;
  }
  puts("getVoronoiSrcRange() expects input range with scale 1:1");
  exit(1);
}

Assistant:

Range getVoronoiSrcRange(Range r)
{
    if (r.scale != 1)
    {
        printf("getVoronoiSrcRange() expects input range with scale 1:1\n");
        exit(1);
    }

    Range s; // output has scale 1:4
    int x = r.x - 2;
    int z = r.z - 2;
    s.scale = 4;
    s.x = x >> 2;
    s.z = z >> 2;
    s.sx = ((x + r.sx) >> 2) - s.x + 2;
    s.sz = ((z + r.sz) >> 2) - s.z + 2;
    if (r.sy < 1)
    {
        s.y = s.sy = 0;
    }
    else
    {
        int ty = r.y - 2;
        s.y = ty >> 2;
        s.sy = ((ty + r.sy) >> 2) - s.y + 2;
    }
    return s;
}